

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

void __thiscall rpc_tests::rpc_ban::test_method(rpc_ban *this)

{
  long lVar1;
  seconds mock_time_in;
  seconds mock_time_in_00;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  bool bVar2;
  string *psVar3;
  duration<long,_std::ratio<1L,_1L>_> *pdVar4;
  long lVar5;
  rep rVar6;
  UniValue *pUVar7;
  UniValue *pUVar8;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffcbf8;
  char *in_stack_ffffffffffffcc00;
  char *in_stack_ffffffffffffcc08;
  UniValue *in_stack_ffffffffffffcc10;
  undefined7 in_stack_ffffffffffffcc18;
  undefined1 in_stack_ffffffffffffcc1f;
  UniValue *in_stack_ffffffffffffcc20;
  UniValue *in_stack_ffffffffffffcc28;
  const_string *in_stack_ffffffffffffcc30;
  const_string *file;
  allocator<char> *in_stack_ffffffffffffcc38;
  char *in_stack_ffffffffffffcc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffcc48;
  undefined6 in_stack_ffffffffffffcc58;
  undefined1 in_stack_ffffffffffffcc5e;
  undefined1 in_stack_ffffffffffffcc5f;
  string *in_stack_ffffffffffffcc98;
  RPCTestingSetup *in_stack_ffffffffffffcca0;
  runtime_error *ex_3;
  runtime_error *ex_2;
  runtime_error *ex_1;
  int64_t ban_created;
  runtime_error *ex;
  rpc_ban *this_local;
  undefined1 local_2a90 [16];
  undefined1 local_2a80 [184];
  const_string local_29c8;
  lazy_ostream local_29b8 [2];
  assertion_result local_2998 [2];
  allocator<char> local_2959 [105];
  const_string local_28f0;
  lazy_ostream local_28e0 [2];
  assertion_result local_28c0 [2];
  allocator<char> local_2881 [105];
  const_string local_2818;
  lazy_ostream local_2808 [2];
  assertion_result local_27e8 [2];
  allocator<char> local_27a9;
  undefined1 local_27a8 [16];
  undefined1 local_2798 [184];
  const_string local_26e0;
  lazy_ostream local_26d0 [2];
  assertion_result local_26b0 [2];
  allocator<char> local_2671 [105];
  const_string local_2608;
  lazy_ostream local_25f8 [2];
  assertion_result local_25d8 [2];
  allocator<char> local_2599 [105];
  const_string local_2530;
  lazy_ostream local_2520 [2];
  assertion_result local_2500 [2];
  allocator<char> local_24c1;
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [184];
  const_string local_23f8;
  lazy_ostream local_23e8 [2];
  assertion_result local_23c8 [2];
  allocator<char> local_2389 [105];
  const_string local_2320;
  lazy_ostream local_2310 [2];
  assertion_result local_22f0 [2];
  allocator<char> local_22b1 [105];
  const_string local_2248;
  lazy_ostream local_2238 [2];
  assertion_result local_2218 [2];
  allocator<char> local_21d9 [37];
  UniValue local_21b4 [2];
  const_string local_20f0;
  lazy_ostream local_20e0 [2];
  assertion_result local_20c0 [2];
  allocator<char> local_2081 [105];
  const_string local_2018;
  lazy_ostream local_2008 [2];
  assertion_result local_1fe8 [2];
  allocator<char> local_1fa9 [105];
  const_string local_1f40;
  lazy_ostream local_1f30 [2];
  assertion_result local_1f10 [2];
  allocator<char> local_1ed1 [137];
  const_string local_1e48;
  lazy_ostream local_1e38 [2];
  assertion_result local_1e18 [2];
  allocator<char> local_1ddd;
  UniValue local_1ddc [2];
  const_string local_1d18;
  lazy_ostream local_1d08 [2];
  assertion_result local_1ce8 [2];
  allocator<char> local_1ca9 [105];
  const_string local_1c40;
  lazy_ostream local_1c30 [2];
  assertion_result local_1c10 [2];
  allocator<char> local_1bd1 [105];
  const_string local_1b68;
  lazy_ostream local_1b58 [2];
  assertion_result local_1b38 [2];
  allocator<char> local_1af9 [33];
  undefined1 local_1ad8 [16];
  undefined1 local_1ac8 [64];
  UniValue local_1a88;
  UniValue local_1a30;
  undefined1 local_19d8 [16];
  undefined1 local_19c8 [80];
  int64_t time_remaining;
  int64_t ban_duration;
  const_string local_18c0;
  lazy_ostream local_18b0 [2];
  assertion_result local_1890 [2];
  allocator<char> local_1851;
  int64_t time_remaining_expected;
  _Alloc_hider local_1848;
  size_type local_1840;
  const_string local_17d0;
  lazy_ostream local_17c0 [2];
  assertion_result local_17a0 [2];
  allocator<char> local_1761;
  undefined8 local_1760;
  seconds now;
  const_string local_16e8;
  lazy_ostream local_16d8 [2];
  assertion_result local_16b8 [2];
  allocator<char> local_1679;
  UniValue local_1678;
  undefined1 local_1620 [16];
  undefined1 local_1610 [80];
  int64_t banned_until;
  const_string local_1540;
  lazy_ostream local_1530 [2];
  assertion_result local_1510 [2];
  allocator<char> local_14d1 [105];
  const_string local_1468;
  lazy_ostream local_1458 [2];
  assertion_result local_1438 [2];
  allocator<char> local_13fd;
  UniValue local_13fc [2];
  const_string local_1338;
  lazy_ostream local_1328 [2];
  assertion_result local_1308 [2];
  allocator<char> local_12c9 [105];
  const_string local_1260;
  lazy_ostream local_1250 [2];
  assertion_result local_1230 [2];
  allocator<char> local_11f1;
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [184];
  const_string local_1128;
  lazy_ostream local_1118 [2];
  assertion_result local_10f8 [2];
  allocator<char> local_10b9 [105];
  const_string local_1050;
  lazy_ostream local_1040 [2];
  assertion_result local_1020;
  undefined8 local_1000;
  allocator<char> local_fe1 [137];
  const_string local_f58;
  lazy_ostream local_f48 [2];
  assertion_result local_f28 [2];
  allocator<char> local_ee9 [105];
  const_string local_e80;
  lazy_ostream local_e70 [2];
  assertion_result local_e50 [2];
  allocator<char> local_e11 [2761];
  UniValue adr;
  UniValue o1;
  UniValue ar;
  UniValue r;
  
  local_1000 = 0;
  local_2008[0].m_empty = false;
  local_2008[0]._9_7_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_e11);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [60])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_e50,local_e70,&local_e80,0x13c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::UniValue((UniValue *)in_stack_ffffffffffffcbf8);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_ee9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [73])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_f28,local_f48,&local_f58,0x13f,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[73],_const_char_(&)[73]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[73],_const_char_(&)[73]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_fe1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [53])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(&local_1020,local_1040,&local_1050,0x140,CHECK)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_10b9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_10f8,local_1118,&local_1128,0x141,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::UniValue(in_stack_ffffffffffffcc28,in_stack_ffffffffffffcc20);
  UniValue::operator[](in_stack_ffffffffffffcc10,(size_t)in_stack_ffffffffffffcc08);
  UniValue::get_obj((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::UniValue(in_stack_ffffffffffffcc28,in_stack_ffffffffffffcc20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key._M_str = (char *)in_stack_ffffffffffffcc48;
  key._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key);
  UniValue::UniValue(in_stack_ffffffffffffcc28,in_stack_ffffffffffffcc20);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    psVar3 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffcc00);
    in_stack_ffffffffffffcc08 = "\"127.0.0.0/32\"";
    in_stack_ffffffffffffcc00 = "127.0.0.0/32";
    in_stack_ffffffffffffcbf8 = "adr.get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (local_11e0,local_11f0,0x145,1,2,psVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(&local_11f1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [72])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1230,local_1250,&local_1260,0x146,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[72],_const_char_(&)[72]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[72],_const_char_(&)[72]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_12c9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1308,local_1328,&local_1338,0x147,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    local_13fc[0]._4_8_ = UniValue::size((UniValue *)in_stack_ffffffffffffcbf8);
    local_13fc[0].typ = VNULL;
    in_stack_ffffffffffffcc08 = "0U";
    in_stack_ffffffffffffcc00 = (char *)local_13fc;
    in_stack_ffffffffffffcbf8 = "ar.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_13fc[0].val.field_2 + 4),
               (undefined1 *)((long)&local_13fc[0].val._M_dataplus._M_p + 4),0x149,1,2,
               &local_13fc[0].field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(&local_13fd);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [92])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1438,local_1458,&local_1468,0x14b,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[92],_const_char_(&)[92]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[92],_const_char_(&)[92]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_14d1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1510,local_1530,&local_1540,0x14c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator[](in_stack_ffffffffffffcc10,(size_t)in_stack_ffffffffffffcc08);
  UniValue::get_obj((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_00._M_str = (char *)in_stack_ffffffffffffcc48;
  key_00._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_01._M_str = (char *)in_stack_ffffffffffffcc48;
  key_01._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_01);
  banned_until = UniValue::getInt<long>
                           ((UniValue *)
                            CONCAT17(in_stack_ffffffffffffcc5f,
                                     CONCAT16(in_stack_ffffffffffffcc5e,in_stack_ffffffffffffcc58)))
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    psVar3 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffcc00);
    in_stack_ffffffffffffcc08 = "\"127.0.0.0/24\"";
    in_stack_ffffffffffffcc00 = "127.0.0.0/24";
    in_stack_ffffffffffffcbf8 = "adr.get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (local_1610,local_1620,0x151,1,2,psVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    local_1678.typ = 0x4e8bfb00;
    local_1678._4_4_ = 2;
    in_stack_ffffffffffffcc08 = "9907731200";
    in_stack_ffffffffffffcc00 = (char *)&local_1678;
    in_stack_ffffffffffffcbf8 = "banned_until";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1678.val.field_2,&local_1678.val,0x152,1,2,&banned_until);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(&local_1679);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [60])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_16b8,local_16d8,&local_16e8,0x154,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  now.__r = 10000;
  local_1760 = 10000;
  mock_time_in.__r._7_1_ = in_stack_ffffffffffffcc1f;
  mock_time_in.__r._0_7_ = in_stack_ffffffffffffcc18;
  SetMockTime(mock_time_in);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(&local_1761);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [80])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_17a0,local_17c0,&local_17d0,0x158,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[80],_const_char_(&)[80]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[80],_const_char_(&)[80]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_1848._M_p = (pointer)s<(char)50>();
  pdVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator+=
                     ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffcc08,
                      (duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffcc00);
  local_1840 = pdVar4->__r;
  mock_time_in_00.__r._7_1_ = in_stack_ffffffffffffcc1f;
  mock_time_in_00.__r._0_7_ = in_stack_ffffffffffffcc18;
  SetMockTime(mock_time_in_00);
  time_remaining_expected = 0xc6;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(&local_1851);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1890,local_18b0,&local_18c0,0x15b,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator[](in_stack_ffffffffffffcc10,(size_t)in_stack_ffffffffffffcc08);
  UniValue::get_obj((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_02._M_str = (char *)in_stack_ffffffffffffcc48;
  key_02._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_02);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_03._M_str = (char *)in_stack_ffffffffffffcc48;
  key_03._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_03);
  banned_until = UniValue::getInt<long>
                           ((UniValue *)
                            CONCAT17(in_stack_ffffffffffffcc5f,
                                     CONCAT16(in_stack_ffffffffffffcc5e,in_stack_ffffffffffffcc58)))
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_04._M_str = (char *)in_stack_ffffffffffffcc48;
  key_04._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_04);
  lVar5 = UniValue::getInt<long>
                    ((UniValue *)
                     CONCAT17(in_stack_ffffffffffffcc5f,
                              CONCAT16(in_stack_ffffffffffffcc5e,in_stack_ffffffffffffcc58)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_05._M_str = (char *)in_stack_ffffffffffffcc48;
  key_05._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_05);
  ban_duration = UniValue::getInt<long>
                           ((UniValue *)
                            CONCAT17(in_stack_ffffffffffffcc5f,
                                     CONCAT16(in_stack_ffffffffffffcc5e,in_stack_ffffffffffffcc58)))
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_06._M_str = (char *)in_stack_ffffffffffffcc48;
  key_06._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_06);
  time_remaining =
       UniValue::getInt<long>
                 ((UniValue *)
                  CONCAT17(in_stack_ffffffffffffcc5f,
                           CONCAT16(in_stack_ffffffffffffcc5e,in_stack_ffffffffffffcc58)));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    psVar3 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffcc00);
    in_stack_ffffffffffffcc08 = "\"127.0.0.0/24\"";
    in_stack_ffffffffffffcc00 = "127.0.0.0/24";
    in_stack_ffffffffffffcbf8 = "adr.get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (local_19c8,local_19d8,0x163,1,2,psVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    rVar6 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffcbf8);
    local_1a30._0_8_ = rVar6 + 0xc6;
    in_stack_ffffffffffffcc08 = "time_remaining_expected + now.count()";
    in_stack_ffffffffffffcc00 = (char *)&local_1a30;
    in_stack_ffffffffffffcbf8 = "banned_until";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1a30.val.field_2,&local_1a30.val,0x164,1,2,&banned_until);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    local_1a88._0_8_ = banned_until - lVar5;
    in_stack_ffffffffffffcc08 = "banned_until - ban_created";
    in_stack_ffffffffffffcc00 = (char *)&local_1a88;
    in_stack_ffffffffffffcbf8 = "ban_duration";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1a88.val.field_2,&local_1a88.val,0x165,1,2,&ban_duration);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    in_stack_ffffffffffffcc08 = "time_remaining_expected";
    in_stack_ffffffffffffcc00 = (char *)&time_remaining_expected;
    in_stack_ffffffffffffcbf8 = "time_remaining";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1ac8,local_1ad8,0x166,1,2,&time_remaining);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_1af9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [53])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1b38,local_1b58,&local_1b68,0x169,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_1bd1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [75])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1c10,local_1c30,&local_1c40,0x16b,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[75],_const_char_(&)[75]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[75],_const_char_(&)[75]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_1ca9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1ce8,local_1d08,&local_1d18,0x16c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    local_1ddc[0]._4_8_ = UniValue::size((UniValue *)in_stack_ffffffffffffcbf8);
    local_1ddc[0].typ = VNULL;
    in_stack_ffffffffffffcc08 = "0U";
    in_stack_ffffffffffffcc00 = (char *)local_1ddc;
    in_stack_ffffffffffffcbf8 = "ar.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_1ddc[0].val.field_2 + 4),
               (undefined1 *)((long)&local_1ddc[0].val._M_dataplus._M_p + 4),0x16e,1,2,
               &local_1ddc[0].field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(&local_1ddd);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [85])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1e18,local_1e38,&local_1e48,0x170,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[85],_const_char_(&)[85]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[85],_const_char_(&)[85]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_1ed1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [53])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1f10,local_1f30,&local_1f40,0x171,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_1fa9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [60])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1fe8,local_2008,&local_2018,0x173,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_2081);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_20c0,local_20e0,&local_20f0,0x174,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    local_21b4[0]._4_8_ = UniValue::size((UniValue *)in_stack_ffffffffffffcbf8);
    local_21b4[0].typ = VNULL;
    in_stack_ffffffffffffcc08 = "0U";
    in_stack_ffffffffffffcc00 = (char *)local_21b4;
    in_stack_ffffffffffffcbf8 = "ar.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              ((undefined1 *)((long)&local_21b4[0].val.field_2 + 4),
               (undefined1 *)((long)&local_21b4[0].val._M_dataplus._M_p + 4),0x176,1,2,
               &local_21b4[0].field_0x4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_21d9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [53])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2218,local_2238,&local_2248,0x179,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[53],_const_char_(&)[53]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_22b1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [103])in_stack_ffffffffffffcbf8
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_22f0,local_2310,&local_2320,0x17c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[103],_const_char_(&)[103]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[103],_const_char_(&)[103]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_2389);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_23c8,local_23e8,&local_23f8,0x17d,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator[](in_stack_ffffffffffffcc10,(size_t)in_stack_ffffffffffffcc08);
  UniValue::get_obj((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_07._M_str = (char *)in_stack_ffffffffffffcc48;
  key_07._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_07);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    psVar3 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffcc00);
    in_stack_ffffffffffffcc08 = "\"fe80::202:b3ff:fe1e:8329/128\"";
    in_stack_ffffffffffffcc00 = "fe80::202:b3ff:fe1e:8329/128";
    in_stack_ffffffffffffcbf8 = "adr.get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[29]>
              (local_24b0,local_24c0,0x181,1,2,psVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(&local_24c1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [60])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2500,local_2520,&local_2530,0x183,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_2599);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [96])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_25d8,local_25f8,&local_2608,0x184,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[96],_const_char_(&)[96]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[96],_const_char_(&)[96]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_2671);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_26b0,local_26d0,&local_26e0,0x185,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator[](in_stack_ffffffffffffcc10,(size_t)in_stack_ffffffffffffcc08);
  UniValue::get_obj((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_08._M_str = (char *)in_stack_ffffffffffffcc48;
  key_08._M_len = (size_t)in_stack_ffffffffffffcc40;
  UniValue::find_value(in_stack_ffffffffffffcc20,key_08);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
               (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    psVar3 = UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffcc00);
    in_stack_ffffffffffffcc08 = "\"2001:db8::/30\"";
    in_stack_ffffffffffffcc00 = "2001:db8::/30";
    in_stack_ffffffffffffcbf8 = "adr.get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[14]>
              (local_2798,local_27a8,0x189,1,2,psVar3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(&local_27a9);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [60])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_27e8,local_2808,&local_2818,0x18b,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[60],_const_char_(&)[60]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_2881);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [106])in_stack_ffffffffffffcbf8
                );
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_28c0,local_28e0,&local_28f0,0x18c,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[106],_const_char_(&)[106]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[106],_const_char_(&)[106]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38);
    RPCTestingSetup::CallRPC(in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98);
    UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00)
    ;
    UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffcbf8);
    std::allocator<char>::~allocator(local_2959);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffcc38,in_stack_ffffffffffffcc30,
                 (size_t)in_stack_ffffffffffffcc28,(const_string *)in_stack_ffffffffffffcc20);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcc08,
                 SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [63])in_stack_ffffffffffffcbf8)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
                 (unsigned_long)in_stack_ffffffffffffcbf8);
      in_stack_ffffffffffffcbf8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2998,local_29b8,&local_29c8,0x18d,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                          *)in_stack_ffffffffffffcbf8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffcbf8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::get_array((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  pUVar7 = UniValue::operator[](in_stack_ffffffffffffcc10,(size_t)in_stack_ffffffffffffcc08);
  pUVar8 = UniValue::get_obj((UniValue *)in_stack_ffffffffffffcc00);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffcc1f,in_stack_ffffffffffffcc18),
             (char *)in_stack_ffffffffffffcc10);
  key_09._M_str = (char *)pUVar7;
  key_09._M_len = (size_t)pUVar8;
  pUVar7 = UniValue::find_value(in_stack_ffffffffffffcc20,key_09);
  UniValue::operator=((UniValue *)in_stack_ffffffffffffcc08,(UniValue *)in_stack_ffffffffffffcc00);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcbf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)pUVar7,file,(size_t)in_stack_ffffffffffffcc28,
               (const_string *)in_stack_ffffffffffffcc20);
    in_stack_ffffffffffffcc28 = (UniValue *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffcc00,(char (*) [1])in_stack_ffffffffffffcbf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcc08,in_stack_ffffffffffffcc00,
               (unsigned_long)in_stack_ffffffffffffcbf8);
    in_stack_ffffffffffffcc20 =
         (UniValue *)UniValue::get_str_abi_cxx11_((UniValue *)in_stack_ffffffffffffcc00);
    in_stack_ffffffffffffcc08 = "\"2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128\"";
    in_stack_ffffffffffffcc00 = "2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128";
    in_stack_ffffffffffffcbf8 = "adr.get_str()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[43]>
              (local_2a80,local_2a90,0x191,1,2,in_stack_ffffffffffffcc20);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffcbf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
  UniValue::~UniValue((UniValue *)in_stack_ffffffffffffcbf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_ban)
{
    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));

    UniValue r;
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0 add")));
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.0.0:8334")), std::runtime_error); //portnumber for setban not allowed
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    UniValue ar = r.get_array();
    UniValue o1 = ar[0].get_obj();
    UniValue adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/32");
    BOOST_CHECK_NO_THROW(CallRPC(std::string("setban 127.0.0.0 remove")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);

    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/24 add 9907731200 true")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    int64_t banned_until{o1.find_value("banned_until").getInt<int64_t>()};
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/24");
    BOOST_CHECK_EQUAL(banned_until, 9907731200); // absolute time check

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));

    auto now = 10'000s;
    SetMockTime(now);
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/24 add 200")));
    SetMockTime(now += 2s);
    const int64_t time_remaining_expected{198};
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    banned_until = o1.find_value("banned_until").getInt<int64_t>();
    const int64_t ban_created{o1.find_value("ban_created").getInt<int64_t>()};
    const int64_t ban_duration{o1.find_value("ban_duration").getInt<int64_t>()};
    const int64_t time_remaining{o1.find_value("time_remaining").getInt<int64_t>()};
    BOOST_CHECK_EQUAL(adr.get_str(), "127.0.0.0/24");
    BOOST_CHECK_EQUAL(banned_until, time_remaining_expected + now.count());
    BOOST_CHECK_EQUAL(ban_duration, banned_until - ban_created);
    BOOST_CHECK_EQUAL(time_remaining, time_remaining_expected);

    // must throw an exception because 127.0.0.1 is in already banned subnet range
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.0.1 add")), std::runtime_error);

    BOOST_CHECK_NO_THROW(CallRPC(std::string("setban 127.0.0.0/24 remove")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);

    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 127.0.0.0/255.255.0.0 add")));
    BOOST_CHECK_THROW(r = CallRPC(std::string("setban 127.0.1.1 add")), std::runtime_error);

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    BOOST_CHECK_EQUAL(ar.size(), 0U);


    BOOST_CHECK_THROW(r = CallRPC(std::string("setban test add")), std::runtime_error); //invalid IP

    //IPv6 tests
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban FE80:0000:0000:0000:0202:B3FF:FE1E:8329 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "fe80::202:b3ff:fe1e:8329/128");

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 2001:db8::/ffff:fffc:0:0:0:0:0:0 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "2001:db8::/30");

    BOOST_CHECK_NO_THROW(CallRPC(std::string("clearbanned")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("setban 2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128 add")));
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("listbanned")));
    ar = r.get_array();
    o1 = ar[0].get_obj();
    adr = o1.find_value("address");
    BOOST_CHECK_EQUAL(adr.get_str(), "2001:4d48:ac57:400:cacf:e9ff:fe1d:9c63/128");
}